

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCA.cpp
# Opt level: O1

int main(void)

{
  pointer puVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  network_address_t dst;
  long lVar5;
  tuple<Node_*,_std::default_delete<Node>_> this;
  long *plVar6;
  Network *this_00;
  int *piVar7;
  ostream *poVar8;
  ulong uVar9;
  Node *pNVar10;
  int j;
  uint __len;
  long lVar11;
  int iVar12;
  uint __val;
  unique_ptr<Node,_std::default_delete<Node>_> *node;
  pointer puVar13;
  double dVar14;
  string __str;
  string str;
  vector<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>
  nodes;
  Message request;
  Client client;
  string local_188;
  undefined1 *local_168;
  undefined8 local_160;
  undefined1 local_158;
  undefined7 uStack_157;
  vector<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>
  local_148;
  undefined1 local_128 [8];
  _Alloc_hider local_120;
  _func_int **local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_110;
  time_t local_100;
  network_address_t local_f8;
  _Alloc_hider local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0 [2];
  network_address_t local_c0;
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  Client local_98;
  
  lVar5 = std::chrono::_V2::system_clock::now();
  Client::Client(&local_98);
  local_148.
  super__Vector_base<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.
  super__Vector_base<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar12 = 10;
  do {
    this.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
    super__Head_base<0UL,_Node_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>)operator_new(0x148);
    memset((void *)this.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
                   super__Head_base<0UL,_Node_*,_false>._M_head_impl,0,0x148);
    NetworkNode::NetworkNode
              ((NetworkNode *)
               this.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
               super__Head_base<0UL,_Node_*,_false>._M_head_impl);
    *(undefined ***)
     this.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
     super__Head_base<0UL,_Node_*,_false>._M_head_impl = &PTR_OnRecvMsg_0010cd80;
    ((NetworkNode *)
    ((long)this.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
           super__Head_base<0UL,_Node_*,_false>._M_head_impl + 0x38))->_vptr_NetworkNode =
         (_func_int **)0x0;
    *(size_t *)
     ((long)this.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
            super__Head_base<0UL,_Node_*,_false>._M_head_impl + 0x40) = 0;
    (((mutex *)
     ((long)this.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
            super__Head_base<0UL,_Node_*,_false>._M_head_impl + 0x48))->super___mutex_base)._M_mutex
    .__align = 0;
    *(_Elt_pointer *)
     ((long)this.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
            super__Head_base<0UL,_Node_*,_false>._M_head_impl + 0x50) = (_Elt_pointer)0x0;
    *(_Elt_pointer *)
     ((long)this.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
            super__Head_base<0UL,_Node_*,_false>._M_head_impl + 0x58) = (_Elt_pointer)0x0;
    *(_Map_pointer *)
     ((long)this.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
            super__Head_base<0UL,_Node_*,_false>._M_head_impl + 0x60) = (_Map_pointer)0x0;
    ((iterator *)
    ((long)this.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
           super__Head_base<0UL,_Node_*,_false>._M_head_impl + 0x68))->_M_cur = (_Elt_pointer)0x0;
    ((NetworkNode *)
    ((long)this.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
           super__Head_base<0UL,_Node_*,_false>._M_head_impl + 0x70))->_vptr_NetworkNode =
         (_func_int **)0x0;
    *(_Elt_pointer *)
     ((long)this.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
            super__Head_base<0UL,_Node_*,_false>._M_head_impl + 0x78) = (_Elt_pointer)0x0;
    (((mutex *)
     ((long)this.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
            super__Head_base<0UL,_Node_*,_false>._M_head_impl + 0x80))->super___mutex_base)._M_mutex
    .__align = 0;
    std::_Deque_base<Message,_std::allocator<Message>_>::_M_initialize_map
              ((_Deque_base<Message,_std::allocator<Message>_> *)
               ((long)this.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
                      super__Head_base<0UL,_Node_*,_false>._M_head_impl + 0x38),0);
    Sealer::Sealer((Sealer *)
                   ((long)this.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
                          super__Head_base<0UL,_Node_*,_false>._M_head_impl + 0x88));
    Blockchain::Blockchain
              ((Blockchain *)
               ((long)this.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
                      super__Head_base<0UL,_Node_*,_false>._M_head_impl + 0xd0));
    (((mutex *)
     ((long)this.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
            super__Head_base<0UL,_Node_*,_false>._M_head_impl + 0xf0))->super___mutex_base)._M_mutex
    .__align = 0;
    *(pointer *)
     ((long)this.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
            super__Head_base<0UL,_Node_*,_false>._M_head_impl + 0xf8) = (pointer)0x0;
    *(pointer *)
     ((long)this.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
            super__Head_base<0UL,_Node_*,_false>._M_head_impl + 0x100) = (pointer)0x0;
    (((_Rb_tree_header *)
     ((long)this.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
            super__Head_base<0UL,_Node_*,_false>._M_head_impl + 0x110))->_M_header)._M_color =
         _S_red;
    ((NetworkNode *)
    ((long)this.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
           super__Head_base<0UL,_Node_*,_false>._M_head_impl + 0x118))->_vptr_NetworkNode =
         (_func_int **)0x0;
    *(_Base_ptr *)
     ((long)this.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
            super__Head_base<0UL,_Node_*,_false>._M_head_impl + 0x120) =
         (_Base_ptr)
         ((long)this.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
                super__Head_base<0UL,_Node_*,_false>._M_head_impl + 0x110);
    (((mutex *)
     ((long)this.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
            super__Head_base<0UL,_Node_*,_false>._M_head_impl + 0x128))->super___mutex_base).
    _M_mutex.__align =
         (long)this.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
               super__Head_base<0UL,_Node_*,_false>._M_head_impl + 0x110;
    *(size_t *)
     ((long)this.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
            super__Head_base<0UL,_Node_*,_false>._M_head_impl + 0x130) = 0;
    *(size_t *)
     ((long)this.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
            super__Head_base<0UL,_Node_*,_false>._M_head_impl + 0x138) = 0;
    *(size_t *)
     ((long)this.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
            super__Head_base<0UL,_Node_*,_false>._M_head_impl + 0x140) = 0;
    local_128 = (undefined1  [8])
                this.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
                super__Head_base<0UL,_Node_*,_false>._M_head_impl;
    std::
    vector<std::unique_ptr<Node,std::default_delete<Node>>,std::allocator<std::unique_ptr<Node,std::default_delete<Node>>>>
    ::emplace_back<std::unique_ptr<Node,std::default_delete<Node>>>
              ((vector<std::unique_ptr<Node,std::default_delete<Node>>,std::allocator<std::unique_ptr<Node,std::default_delete<Node>>>>
                *)&local_148,(unique_ptr<Node,_std::default_delete<Node>_> *)local_128);
    if ((_Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>)local_128 != (Node *)0x0) {
      std::default_delete<Node>::operator()((default_delete<Node> *)local_128,(Node *)local_128);
    }
    puVar1 = local_148.
             super__Vector_base<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    iVar12 = iVar12 + -1;
  } while (iVar12 != 0);
  if (local_148.
      super__Vector_base<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_148.
      super__Vector_base<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    puVar13 = local_148.
              super__Vector_base<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      Node::SetAllNodes((puVar13->_M_t).super___uniq_ptr_impl<Node,_std::default_delete<Node>_>._M_t
                        .super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
                        super__Head_base<0UL,_Node_*,_false>._M_head_impl,&local_148);
      puVar13 = puVar13 + 1;
    } while (puVar13 != puVar1);
  }
  __val = 0;
  do {
    local_168 = &local_158;
    local_160 = 0;
    local_158 = 0;
    __len = 1;
    if (9 < __val) {
      uVar9 = (ulong)__val;
      uVar2 = 4;
      do {
        __len = uVar2;
        uVar4 = (uint)uVar9;
        if (uVar4 < 100) {
          __len = __len - 2;
          goto LAB_00108625;
        }
        if (uVar4 < 1000) {
          __len = __len - 1;
          goto LAB_00108625;
        }
        if (uVar4 < 10000) goto LAB_00108625;
        uVar9 = uVar9 / 10000;
        uVar2 = __len + 4;
      } while (99999 < uVar4);
      __len = __len + 1;
    }
LAB_00108625:
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_188,(char)__len);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_188._M_dataplus._M_p,__len,__val);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_188,0,(char *)0x0,0x1092d0);
    pNVar10 = (Node *)(plVar6 + 2);
    if ((Node *)*plVar6 == pNVar10) {
      local_118 = (pNVar10->super_NetworkNode)._vptr_NetworkNode;
      aStack_110._M_allocated_capacity = plVar6[3];
      local_128 = (undefined1  [8])&local_118;
    }
    else {
      local_118 = (pNVar10->super_NetworkNode)._vptr_NetworkNode;
      local_128 = (undefined1  [8])*plVar6;
    }
    local_120._M_p = (pointer)plVar6[1];
    *plVar6 = (long)pNVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_168,(string *)local_128);
    if (local_128 != (undefined1  [8])&local_118) {
      operator_delete((void *)local_128,(long)local_118 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
    Message::Message((Message *)local_128,REQUEST);
    local_100 = time((time_t *)0x0);
    std::__cxx11::string::_M_assign((string *)&local_120);
    local_f8 = NetworkNode::GetNodeAddress(&local_98.super_NetworkNode);
    local_c0 = local_f8;
    Message::diggest_abi_cxx11_(&local_188,(Message *)local_128);
    std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
    Message::str_abi_cxx11_(&local_188,(Message *)local_128);
    std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
    lVar11 = 0;
    do {
      dst = NetworkNode::GetNodeAddress
                      (&(local_148.
                         super__Vector_base<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar11]._M_t.
                         super___uniq_ptr_impl<Node,_std::default_delete<Node>_>._M_t.
                         super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
                         super__Head_base<0UL,_Node_*,_false>._M_head_impl)->super_NetworkNode);
      Client::SendRequest(&local_98,dst,(Message *)local_128);
      lVar11 = lVar11 + 1;
    } while (lVar11 != 10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_p != &local_a8) {
      operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_p != local_e0) {
      operator_delete(local_f0._M_p,local_e0[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_p != &aStack_110) {
      operator_delete(local_120._M_p,aStack_110._M_allocated_capacity + 1);
    }
    if (local_168 != &local_158) {
      operator_delete(local_168,CONCAT71(uStack_157,local_158) + 1);
    }
    __val = __val + 1;
  } while (__val != 12000);
  do {
    this_00 = Network::instance();
    bVar3 = Network::Empty(this_00);
    if (bVar3) {
      lVar11 = std::chrono::_V2::system_clock::now();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"elapsed: ",9);
      dVar14 = (double)(lVar11 - lVar5) / 1000000000.0;
      poVar8 = std::ostream::_M_insert<double>(dVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," seconds",8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"TPS: ",5);
      poVar8 = std::ostream::_M_insert<double>(12000.0 / dVar14);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      std::
      vector<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>
      ::~vector(&local_148);
      local_98.super_NetworkNode._vptr_NetworkNode = (_func_int **)&PTR_OnRecvMsg_0010cd50;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~_Rb_tree(&local_98.accepted_reply._M_t);
      return 0;
    }
    local_128 = (undefined1  [8])0x1;
    local_120._M_p = (pointer)0x0;
    do {
      iVar12 = nanosleep((timespec *)local_128,(timespec *)local_128);
      if (iVar12 != -1) break;
      piVar7 = __errno_location();
    } while (*piVar7 == 4);
  } while( true );
}

Assistant:

int main()
{
    using namespace std::chrono;
    auto start = system_clock::now();

    Client client;
    std::vector<std::unique_ptr<Node>> nodes;
    for (int i = 0; i < Num_Node; i++)
    {
        nodes.push_back(std::make_unique<Node>());
    }

    for (auto & node : nodes)
    {
        node->SetAllNodes(nodes);
    }
    for(int i = 0; i < NUMOFTRANS; i++)
    {
        std::string str;
        str = "Test"+ to_string(i);
        Message request(Message::REQUEST);
        request.t = std::time(nullptr);
        request.o = str;
        request.c = request.i = client.GetNodeAddress();
        request.d = request.diggest();
        request.m = request.str();
        for(int j = 0; j < Num_Node; j++)
        {
          client.SendRequest(nodes[j]->GetNodeAddress(),request);
        }
    }
    while (!Network::instance().Empty())
        std::this_thread::sleep_for(1s);

    duration<double> diff = system_clock::now() - start;
    cout<<"elapsed: " << diff.count() << " seconds" <<endl;
    cout<<"TPS: " << NUMOFTRANS/diff.count()<<endl;

	return 0;
}